

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompression.cpp
# Opt level: O0

void anon_unknown.dwarf_1e5e41::fillPixels4
               (Array2D<unsigned_int> *pi,Array2D<half> *ph,Array2D<float> *pf,int width,int height)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ostream *this;
  long lVar4;
  uint *puVar5;
  half *phVar6;
  float *pfVar7;
  int in_ECX;
  Array2D<float> *in_RDX;
  Array2D<half> *in_RSI;
  Array2D<unsigned_int> *in_RDI;
  int in_R8D;
  anon_union_4_2_947300a4 u;
  int x;
  int y;
  Rand48 rand;
  unsigned_long in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar8;
  bool local_41;
  int local_30;
  int local_2c;
  
  this = std::operator<<((ostream *)&std::cout,"random bits");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Rand48::Rand48
            ((Rand48 *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  for (local_2c = 0; local_2c < in_R8D; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < in_ECX; local_30 = local_30 + 1) {
      lVar4 = Imath_2_5::Rand48::nexti((Rand48 *)0x206ae2);
      puVar5 = Imf_2_5::Array2D<unsigned_int>::operator[](in_RDI,(long)local_2c);
      puVar5[local_30] = (uint)lVar4;
      do {
        phVar6 = Imf_2_5::Array2D<half>::operator[](in_RSI,(long)local_2c);
        lVar4 = Imath_2_5::Rand48::nexti((Rand48 *)0x206b2a);
        half::setBits(phVar6 + local_30,(unsigned_short)lVar4);
        phVar6 = Imf_2_5::Array2D<half>::operator[](in_RSI,(long)local_2c);
        bVar1 = half::isNan(phVar6 + local_30);
        local_41 = true;
        if (!bVar1) {
          phVar6 = Imf_2_5::Array2D<half>::operator[](in_RSI,(long)local_2c);
          local_41 = half::isInfinity(phVar6 + local_30);
        }
      } while (local_41 != false);
      do {
        lVar4 = Imath_2_5::Rand48::nexti((Rand48 *)0x206ba4);
        pfVar7 = Imf_2_5::Array2D<float>::operator[](in_RDX,(long)local_2c);
        pfVar7[local_30] = (float)lVar4;
        pfVar7 = Imf_2_5::Array2D<float>::operator[](in_RDX,(long)local_2c);
        uVar2 = std::isnan((double)(ulong)(uint)pfVar7[local_30]);
        bVar8 = 1;
        if ((uVar2 & 1) == 0) {
          pfVar7 = Imf_2_5::Array2D<float>::operator[](in_RDX,(long)local_2c);
          iVar3 = std::isinf((double)(ulong)(uint)pfVar7[local_30]);
          bVar8 = (byte)iVar3;
        }
      } while ((bVar8 & 1) != 0);
    }
  }
  return;
}

Assistant:

void
fillPixels4 (Array2D<unsigned int> &pi,
	     Array2D<half> &ph,
	     Array2D<float> &pf,
	     int width,
	     int height)
{
    cout << "random bits" << endl;

    //
    // Use of a union to extract the bit pattern from a float, as is
    // done below, works only if int and float have the same size.
    //

    assert (sizeof (int) == sizeof (float));

    Rand48 rand;

    for (int y = 0; y < height; ++y)
	for (int x = 0; x < width; ++x)
	{
	    pi[y][x] = rand.nexti();

	    ph[y][x].setBits (rand.nexti());

	    union {int i; float f;} u;
	    u.i = rand.nexti();

	    pf[y][x] = u.f;
	}
}